

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

bool __thiscall Cmd::addHistoryEntry(Cmd *this,string *line)

{
  pointer pbVar1;
  __type _Var2;
  
  pbVar1 = (this->history_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->history_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start != pbVar1) &&
     (_Var2 = std::operator==(pbVar1 + -1,line), _Var2)) {
    return false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->history_,line);
  return true;
}

Assistant:

bool addHistoryEntry(const std::string &line) {

		// Don't add duplicated lines.
		if (!history_.empty() && history_.back() == line) {
			return false;
		}

		history_.push_back(line);
		return true;
	}